

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.hpp
# Opt level: O0

size_t io::net::
       read<io::basic_string_stream<char,std::char_traits<char>>,io::net::dynamic_vector_buffer<char,std::allocator<char>>,io::net::transfer_exactly,void>
                 (basic_string_stream<char,_std::char_traits<char>_> *stream,
                 dynamic_vector_buffer<char,_std::allocator<char>_> *b,
                 transfer_exactly completion_condition,error_code *ec)

{
  size_t sVar1;
  size_t sVar2;
  size_t bytes_read;
  mutable_buffers_type buf;
  size_t next_read_size;
  anon_class_8_1_54a39802 calc_next_read_size;
  size_t total_bytes_read;
  error_code *ec_local;
  dynamic_vector_buffer<char,_std::allocator<char>_> *b_local;
  basic_string_stream<char,_std::char_traits<char>_> *stream_local;
  transfer_exactly completion_condition_local;
  
  stream_local = (basic_string_stream<char,_std::char_traits<char>_> *)completion_condition.exact_;
  std::error_code::clear(ec);
  calc_next_read_size.b = (dynamic_vector_buffer<char,_std::allocator<char>_> *)0x0;
  next_read_size = (size_t)b;
  buf.size_ = read<io::basic_string_stream<char,_std::char_traits<char>_>,_io::net::dynamic_vector_buffer<char,_std::allocator<char>_>,_io::net::transfer_exactly,_void>
              ::anon_class_8_1_54a39802::operator()
                        ((anon_class_8_1_54a39802 *)&next_read_size,0x10000);
  do {
    sVar1 = dynamic_vector_buffer<char,_std::allocator<char>_>::size(b);
    sVar2 = dynamic_vector_buffer<char,_std::allocator<char>_>::max_size(b);
    if (sVar2 <= sVar1) {
      return (size_t)calc_next_read_size.b;
    }
    _bytes_read = dynamic_vector_buffer<char,_std::allocator<char>_>::prepare(b,buf.size_);
    sVar1 = detail::memory_stream_impl<io::basic_string_stream<char,_std::char_traits<char>_>,_long>
            ::read_some<io::net::mutable_buffer>
                      (&stream->
                        super_memory_stream_impl<io::basic_string_stream<char,_std::char_traits<char>_>,_long>
                       ,(mutable_buffer *)&bytes_read,ec);
    dynamic_vector_buffer<char,_std::allocator<char>_>::commit(b,sVar1);
    calc_next_read_size.b =
         (dynamic_vector_buffer<char,_std::allocator<char>_> *)
         ((long)&(calc_next_read_size.b)->vec_ + sVar1);
    sVar1 = transfer_exactly::operator()
                      ((transfer_exactly *)&stream_local,ec,(size_t)calc_next_read_size.b);
    buf.size_ = read<io::basic_string_stream<char,_std::char_traits<char>_>,_io::net::dynamic_vector_buffer<char,_std::allocator<char>_>,_io::net::transfer_exactly,_void>
                ::anon_class_8_1_54a39802::operator()
                          ((anon_class_8_1_54a39802 *)&next_read_size,sVar1);
  } while (buf.size_ != 0);
  return (size_t)calc_next_read_size.b;
}

Assistant:

std::size_t read(SyncReadStream& stream, DynamicBuffer&& b,
                 CompletionCondition completion_condition,
                 std::error_code& ec)
{
    ec.clear();

    std::size_t total_bytes_read = 0;
    const auto calc_next_read_size = [&b](std::size_t cc_return) {
        return std::min(cc_return, b.max_size() - b.size());
    };
    std::size_t next_read_size = calc_next_read_size(max_single_transfer_size);

    while (b.size() < b.max_size()) {
        auto buf = b.prepare(next_read_size);
        std::size_t bytes_read = stream.read_some(buf, ec);
        b.commit(bytes_read);
        total_bytes_read += bytes_read;
        next_read_size = calc_next_read_size(completion_condition(ec, total_bytes_read));
        if (next_read_size == 0) {
            break;
        }
    }

    return total_bytes_read;
}